

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::append_member_name
          (string *__return_storage_ptr__,CompilerMSL *this,string *qualifier,SPIRType *type,
          uint32_t index)

{
  bool bVar1;
  long lVar2;
  uint32_t uVar3;
  undefined4 in_register_00000084;
  allocator local_75;
  BuiltIn builtin;
  string mbr_name;
  string local_50 [32];
  
  builtin = BuiltInMax;
  uVar3 = index;
  bVar1 = Compiler::is_member_builtin((Compiler *)this,type,index,&builtin);
  if (bVar1) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (__return_storage_ptr__,this,(ulong)builtin,(ulong)type->storage);
  }
  else {
    CompilerGLSL::to_member_name_abi_cxx11_(&mbr_name,&this->super_CompilerGLSL,type,index);
    lVar2 = ::std::__cxx11::string::find_first_not_of((char *)&mbr_name,0x282e15);
    if (lVar2 == -1) {
      ::std::__cxx11::string::string(local_50,"",&local_75);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_50,(ulong)&mbr_name);
    }
    ::std::__cxx11::string::operator=((string *)&mbr_name,local_50);
    ::std::__cxx11::string::~string(local_50);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&>
              (__return_storage_ptr__,(spirv_cross *)qualifier,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x282e15,
               (char (*) [2])&mbr_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,uVar3));
    ::std::__cxx11::string::~string((string *)&mbr_name);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::append_member_name(const string &qualifier, const SPIRType &type, uint32_t index)
{
	// Don't qualify Builtin names because they are unique and are treated as such when building expressions
	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
		return builtin_to_glsl(builtin, type.storage);

	// Strip any underscore prefix from member name
	string mbr_name = to_member_name(type, index);
	size_t startPos = mbr_name.find_first_not_of("_");
	mbr_name = (startPos != string::npos) ? mbr_name.substr(startPos) : "";
	return join(qualifier, "_", mbr_name);
}